

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O1

void __thiscall PDA::Transducer::StoreFst::StoreFst(StoreFst *this,Grammar *grammar)

{
  State::State(&this->m_currentState,L'S');
  State::State(&this->m_mostState,L'S');
  std::vector<PDA::Transducer::Grammar::Rule,_std::allocator<PDA::Transducer::Grammar::Rule>_>::
  vector(&(this->m_grammar).m_rules,&grammar->m_rules);
  (this->m_grammar).m_startSymbol = grammar->m_startSymbol;
  (this->m_tokens).
  super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tokens).
  super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tokens).
  super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_states).c.
  super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_states).c.
  super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->m_states).c.
  super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_states).c.
  super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_states).c.
  super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_states).c.
  super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_states).c.
  super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_states).c.
  super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_states).c.
  super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_states).c.
  super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>::
  _M_initialize_map((_Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
                     *)&this->m_states,0);
  return;
}

Assistant:

StoreFst(const Grammar &grammar) : m_grammar(grammar)
    { }